

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O2

uint16_t __thiscall ProtocolTCP::NewPort(ProtocolTCP *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0x400;
  if (0x400 < (ushort)*(int *)&this->NextPort) {
    iVar1 = *(int *)&this->NextPort;
  }
  iVar1 = iVar1 + 1;
  this->NextPort = (uint16_t)iVar1;
  for (iVar2 = 0; iVar2 < 5; iVar2 = iVar2 + 1) {
    if (*(uint16_t *)(&this->field_0x4 + (long)iVar2 * 0x370) == (uint16_t)iVar1) {
      iVar1 = iVar1 + 1;
      this->NextPort = (uint16_t)iVar1;
      iVar2 = -1;
    }
  }
  return (uint16_t)iVar1;
}

Assistant:

uint16_t ProtocolTCP::NewPort()
{
    int i;

    if (NextPort <= 1024)
    {
        NextPort = 1024;
    }

    NextPort++;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (ConnectionList[i].LocalPort == NextPort)
        {
            NextPort++;
            i = -1;
        }
    }

    return NextPort;
}